

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

BrandArgumentList * __thiscall
capnp::Schema::getBrandArgumentsAtScope
          (BrandArgumentList *__return_storage_ptr__,Schema *this,uint64_t scopeId)

{
  Scope *pSVar1;
  bool bVar2;
  Scope **ppSVar3;
  Scope *scope;
  Iterator __end1;
  Iterator __begin1;
  Range<const_capnp::_::RawBrandedSchema::Scope_*> *__range1;
  Reader local_90;
  ArrayPtr<const_char> local_60;
  Fault local_50;
  Fault f;
  uint64_t scopeId_local;
  Schema *this_local;
  
  getProto((Reader *)&f,this);
  bVar2 = capnp::schema::Node::Reader::getIsGeneric((Reader *)&f);
  if (!bVar2) {
    getProto(&local_90,this);
    local_60 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_90);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],capnp::Text::Reader>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0xfa,FAILED,"getProto().getIsGeneric()",
               "\"Not a generic type.\", getProto().getDisplayName()",
               (char (*) [20])"Not a generic type.",(Reader *)&local_60);
    kj::_::Debug::Fault::fatal(&local_50);
  }
  ___begin1 = kj::range<capnp::_::RawBrandedSchema::Scope_const*>
                        (this->raw->scopes,this->raw->scopes + this->raw->scopeCount);
  __end1 = kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::begin
                     ((Range<const_capnp::_::RawBrandedSchema::Scope_*> *)&__begin1);
  scope = (Scope *)kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::end
                             ((Range<const_capnp::_::RawBrandedSchema::Scope_*> *)&__begin1);
  while( true ) {
    bVar2 = kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::Iterator::operator!=
                      (&__end1,(Iterator *)&scope);
    if (!bVar2) {
      bVar2 = _::RawBrandedSchema::isUnbound(this->raw);
      BrandArgumentList::BrandArgumentList(__return_storage_ptr__,scopeId,bVar2);
      return __return_storage_ptr__;
    }
    ppSVar3 = kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::Iterator::operator*(&__end1);
    pSVar1 = *ppSVar3;
    if (pSVar1->typeId == scopeId) break;
    kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::Iterator::operator++(&__end1);
  }
  if ((pSVar1->isUnbound & 1U) != 0) {
    BrandArgumentList::BrandArgumentList(__return_storage_ptr__,scopeId,true);
    return __return_storage_ptr__;
  }
  BrandArgumentList::BrandArgumentList
            (__return_storage_ptr__,scopeId,pSVar1->bindingCount,pSVar1->bindings);
  return __return_storage_ptr__;
}

Assistant:

Schema::BrandArgumentList Schema::getBrandArgumentsAtScope(uint64_t scopeId) const {
  KJ_REQUIRE(getProto().getIsGeneric(), "Not a generic type.", getProto().getDisplayName());

  for (auto scope: kj::range(raw->scopes, raw->scopes + raw->scopeCount)) {
    if (scope->typeId == scopeId) {
      // OK, this scope matches the scope we're looking for.
      if (scope->isUnbound) {
        return BrandArgumentList(scopeId, true);
      } else {
        return BrandArgumentList(scopeId, scope->bindingCount, scope->bindings);
      }
    }
  }

  // This scope is not listed in the scopes list.
  return BrandArgumentList(scopeId, raw->isUnbound());
}